

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_FeatureUnsupported_Test::testBody(TEST_TestFailure_FeatureUnsupported_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_b8 [72];
  FeatureUnsupportedFailure f;
  TEST_TestFailure_FeatureUnsupported_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f.super_TestFailure.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_b8 + 0x30),"SOME_FEATURE");
  SimpleString::SimpleString((SimpleString *)(local_b8 + 0x20),"");
  FeatureUnsupportedFailure::FeatureUnsupportedFailure
            ((FeatureUnsupportedFailure *)(local_b8 + 0x40),pUVar1,fileName,2,
             (SimpleString *)(local_b8 + 0x30),(SimpleString *)(local_b8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_b8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_b8 + 0x30));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_b8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_b8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "The feature \"SOME_FEATURE\" is not supported in this environment or with the feature set selected when building the library."
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x1ab,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_b8);
  FeatureUnsupportedFailure::~FeatureUnsupportedFailure
            ((FeatureUnsupportedFailure *)(local_b8 + 0x40));
  return;
}

Assistant:

TEST(TestFailure, FeatureUnsupported)
{
    FeatureUnsupportedFailure f(test, failFileName, failLineNumber, "SOME_FEATURE", "");
    FAILURE_EQUAL("The feature \"SOME_FEATURE\" is not supported in this environment or with the feature set selected when building the library.", f);
}